

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo-main.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  reference ppAVar2;
  ostream *poVar3;
  string local_98 [48];
  string local_68 [32];
  Animal *local_48;
  Animal *animal;
  iterator __end1;
  iterator __begin1;
  vector<Animal_*,_std::allocator<Animal_*>_> *__range1;
  
  linktimeplugin::plugins<Animal>();
  __end1 = std::vector<Animal_*,_std::allocator<Animal_*>_>::begin
                     ((vector<Animal_*,_std::allocator<Animal_*>_> *)&__begin1);
  animal = (Animal *)
           std::vector<Animal_*,_std::allocator<Animal_*>_>::end
                     ((vector<Animal_*,_std::allocator<Animal_*>_> *)&__begin1);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Animal_**,_std::vector<Animal_*,_std::allocator<Animal_*>_>_>
                                *)&animal);
    if (!bVar1) break;
    ppAVar2 = __gnu_cxx::
              __normal_iterator<Animal_**,_std::vector<Animal_*,_std::allocator<Animal_*>_>_>::
              operator*(&__end1);
    local_48 = *ppAVar2;
    (**local_48->_vptr_Animal)(local_68);
    poVar3 = std::operator<<((ostream *)&std::cout,local_68);
    poVar3 = std::operator<<(poVar3,": ");
    (*local_48->_vptr_Animal[1])(local_98);
    poVar3 = std::operator<<(poVar3,local_98);
    std::operator<<(poVar3,'\n');
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string(local_68);
    __gnu_cxx::__normal_iterator<Animal_**,_std::vector<Animal_*,_std::allocator<Animal_*>_>_>::
    operator++(&__end1);
  }
  std::vector<Animal_*,_std::allocator<Animal_*>_>::~vector
            ((vector<Animal_*,_std::allocator<Animal_*>_> *)&__begin1);
  return 0;
}

Assistant:

int main() {
    for (const auto animal : linktimeplugin::plugins<Animal>()) {
        std::cout << animal->name() << ": " << animal->sound() << '\n';
    }

    return EXIT_SUCCESS;
}